

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void anon_unknown.dwarf_3a4d::usageMessage(ostream *stream,char *program_name,bool verbose)

{
  ostream *poVar1;
  undefined3 in_register_00000011;
  
  poVar1 = std::operator<<(stream,"Usage: ");
  poVar1 = std::operator<<(poVar1,program_name);
  poVar1 = std::operator<<(poVar1," [options] infile outfile");
  std::endl<char,std::char_traits<char>>(poVar1);
  if (CONCAT31(in_register_00000011,verbose) != 0) {
    std::operator<<(stream,
                    "\nRead an OpenEXR file from infile and save the contents\nin ACES image file outfile.\n\nThe ACES image file format is a subset of the OpenEXR file\nformat.  ACES image files are restricted as follows:\n\n  * Images are stored as scanlines; tiles are not allowed.\n  * Images contain three color channels, either:\n      R, G, B (red, green, blue)\n    or:\n      Y, RY, BY (luminance, sub-sampled chroma)\n  * Images may optionally contain an alpha channel.\n  * Only three compression types are allowed:\n      NO_COMPRESSION (file is not compressed)\n      PIZ_COMPRESSION (lossless)\n      B44A_COMPRESSION (lossy)\n  * The \"chromaticities\" header attribute must specify\n    the ACES RGB primaries and white point.\n\nOptions:\n  -v, --verbose     verbose mode\n  -h, --help        print this message\n      --version     print version information\n\nReport bugs via https://github.com/AcademySoftwareFoundation/openexr/issues or email security@openexr.com\n"
                   );
    return;
  }
  return;
}

Assistant:

void
usageMessage (ostream& stream, const char* program_name, bool verbose = false)
{
    stream << "Usage: " << program_name << " [options] infile outfile" << endl;

    if (verbose)
        stream << "\n"
            "Read an OpenEXR file from infile and save the contents\n"
            "in ACES image file outfile.\n"
            "\n"
            "The ACES image file format is a subset of the OpenEXR file\n"
            "format.  ACES image files are restricted as follows:\n"
            "\n"
            "  * Images are stored as scanlines; tiles are not allowed.\n"
            "  * Images contain three color channels, either:\n"
            "      R, G, B (red, green, blue)\n"
            "    or:\n"
            "      Y, RY, BY (luminance, sub-sampled chroma)\n"
            "  * Images may optionally contain an alpha channel.\n"
            "  * Only three compression types are allowed:\n"
            "      NO_COMPRESSION (file is not compressed)\n"
            "      PIZ_COMPRESSION (lossless)\n"
            "      B44A_COMPRESSION (lossy)\n"
            "  * The \"chromaticities\" header attribute must specify\n"
            "    the ACES RGB primaries and white point.\n"
            "\n"
            "Options:\n"
            "  -v, --verbose     verbose mode\n"
            "  -h, --help        print this message\n"
            "      --version     print version information\n"
            "\n"
            "Report bugs via https://github.com/AcademySoftwareFoundation/openexr/issues or email security@openexr.com\n"
            "";
}